

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_attribute.cpp
# Opt level: O3

adios2_error adios2_attribute_data(void *data,size_t *size,adios2_attribute *attribute)

{
  long lVar1;
  size_t sVar2;
  pointer_____offset_0x10___ *ppuVar3;
  size_t __n;
  ulong uVar4;
  long lVar5;
  char *dataT;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to adios2_attribute_data","");
  adios2::helper::CheckForNullptr<adios2_attribute_const>(attribute,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for data, in call to adios2_attribute_data","");
  adios2::helper::CheckForNullptr<void>(data,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  switch(*(undefined4 *)(attribute + 0x28)) {
  case 1:
    ppuVar3 = &adios2::core::Attribute<signed_char>::typeinfo;
    break;
  case 2:
    ppuVar3 = &adios2::core::Attribute<short>::typeinfo;
    goto LAB_00127c8f;
  case 3:
    ppuVar3 = &adios2::core::Attribute<int>::typeinfo;
    goto LAB_00127cc2;
  case 4:
    ppuVar3 = &adios2::core::Attribute<long>::typeinfo;
    goto LAB_00127cf3;
  case 5:
    ppuVar3 = &adios2::core::Attribute<unsigned_char>::typeinfo;
    break;
  case 6:
    ppuVar3 = &adios2::core::Attribute<unsigned_short>::typeinfo;
LAB_00127c8f:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar3,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined2 *)data = *(undefined2 *)(lVar1 + 0x58);
      goto LAB_00127d69;
    }
    goto LAB_00127d70;
  case 7:
    ppuVar3 = &adios2::core::Attribute<unsigned_int>::typeinfo;
LAB_00127cc2:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar3,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined4 *)data = *(undefined4 *)(lVar1 + 0x58);
      goto LAB_00127d69;
    }
    goto LAB_00127d70;
  case 8:
    ppuVar3 = &adios2::core::Attribute<unsigned_long>::typeinfo;
LAB_00127cf3:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar3,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined8 *)data = *(undefined8 *)(lVar1 + 0x58);
      goto LAB_00127d69;
    }
    goto LAB_00127d70;
  case 9:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<float>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined4 *)data = *(undefined4 *)(lVar1 + 0x58);
      goto LAB_00127d69;
    }
    goto LAB_00127d70;
  case 10:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<double>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) != '\x01') goto LAB_00127d70;
    *(undefined8 *)data = *(undefined8 *)(lVar1 + 0x58);
    goto LAB_00127d69;
  case 0xb:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<long_double>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) != '\x01') goto LAB_00127d70;
    *(unkbyte10 *)data = *(unkbyte10 *)(lVar1 + 0x60);
    goto LAB_00127d69;
  default:
    goto switchD_00127b72_caseD_c;
  case 0xe:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<std::__cxx11::string>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      std::__cxx11::string::copy((char *)(lVar1 + 0x58),(ulong)data,*(ulong *)(lVar1 + 0x60));
      *(undefined1 *)((long)data + *(long *)(lVar1 + 0x60)) = 0;
      *size = 1;
      return adios2_error_none;
    }
    sVar2 = *(size_t *)(lVar1 + 0x30);
    *size = sVar2;
    if (sVar2 == 0) {
      return adios2_error_none;
    }
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::__cxx11::string::copy
                ((char *)(*(long *)(lVar1 + 0x40) + lVar5),*(ulong *)((long)data + uVar4 * 8),
                 *(ulong *)(*(long *)(lVar1 + 0x40) + 8 + lVar5));
      *(undefined1 *)
       (*(long *)((long)data + uVar4 * 8) + *(long *)(*(long *)(lVar1 + 0x40) + 8 + lVar5)) = 0;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < *size);
    return adios2_error_none;
  case 0xf:
    ppuVar3 = &adios2::core::Attribute<char>::typeinfo;
  }
  lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar3,0);
  if (*(char *)(lVar1 + 0x38) == '\x01') {
    *(undefined1 *)data = *(undefined1 *)(lVar1 + 0x58);
LAB_00127d69:
    sVar2 = 1;
  }
  else {
LAB_00127d70:
    __n = *(long *)(lVar1 + 0x48) - (long)*(void **)(lVar1 + 0x40);
    if (__n != 0) {
      memmove(data,*(void **)(lVar1 + 0x40),__n);
    }
    sVar2 = *(size_t *)(lVar1 + 0x30);
  }
  *size = sVar2;
switchD_00127b72_caseD_c:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_attribute_data(void *data, size_t *size, const adios2_attribute *attribute)
{
    try
    {
        adios2::helper::CheckForNullptr(attribute, "in call to adios2_attribute_data");
        adios2::helper::CheckForNullptr(data, "for data, in call to adios2_attribute_data");

        const adios2::core::AttributeBase *attributeBase =
            reinterpret_cast<const adios2::core::AttributeBase *>(attribute);

        const adios2::DataType type(attributeBase->m_Type);

        if (type == adios2::DataType::None)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const adios2::core::Attribute<std::string> *attributeCpp =
                dynamic_cast<const adios2::core::Attribute<std::string> *>(attributeBase);
            if (attributeCpp->m_IsSingleValue)
            {
                char *dataT = reinterpret_cast<char *>(data);
                attributeCpp->m_DataSingleValue.copy(dataT, attributeCpp->m_DataSingleValue.size());
                dataT[attributeCpp->m_DataSingleValue.size()] = '\0';
                *size = 1;
            }
            else
            {
                *size = attributeCpp->m_Elements;
                char **dataT = reinterpret_cast<char **>(data);

                for (size_t e = 0; e < *size; ++e)
                {
                    attributeCpp->m_DataArray[e].copy(dataT[e],
                                                      attributeCpp->m_DataArray[e].size());
                    dataT[e][attributeCpp->m_DataArray[e].size()] = '\0';
                }
            }
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const adios2::core::Attribute<T> *attributeCpp =                                           \
            dynamic_cast<const adios2::core::Attribute<T> *>(attributeBase);                       \
        T *dataT = reinterpret_cast<T *>(data);                                                    \
        if (attributeCpp->m_IsSingleValue)                                                         \
        {                                                                                          \
            *dataT = attributeCpp->m_DataSingleValue;                                              \
            *size = 1;                                                                             \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            std::copy(attributeCpp->m_DataArray.begin(), attributeCpp->m_DataArray.end(), dataT);  \
            *size = attributeCpp->m_Elements;                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_attribute_data"));
    }
}